

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_es5_conformance.cpp
# Opt level: O0

void test_main(void)

{
  uint32_t *this;
  bool bVar1;
  version vVar2;
  int iVar3;
  value_type vVar4;
  _Setw _Var5;
  anon_struct_32_4_a04a10f4 *paVar6;
  int *piVar7;
  int *piVar8;
  type s;
  wostream *pwVar9;
  wchar_t *pwVar10;
  runtime_error *prVar11;
  ostream *poVar12;
  char *in_RCX;
  long lVar13;
  bool bVar14;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  wstring_view wVar15;
  string local_690 [32];
  ostringstream local_670 [8];
  ostringstream oss;
  duration<long,_std::ratio<1L,_1000000000L>_> local_4e8;
  duration<double,_std::ratio<1L,_1L>_> local_4e0;
  rep local_4d8;
  rep d1;
  duration<double,_std::ratio<1L,_1L>_> local_4c8;
  rep local_4c0;
  rep d0;
  exception *e;
  int local_498;
  undefined1 local_491;
  wstring local_490 [32];
  undefined1 local_470 [16];
  string local_460;
  string local_440;
  wchar_t *local_430;
  wchar_t *local_428;
  wostringstream local_420 [8];
  wostringstream woss;
  undefined1 local_2a8 [8];
  value res;
  interpreter local_260;
  interpreter interpreter_;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  wstring local_238;
  undefined1 local_218 [24];
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> local_200;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  char *local_1f0;
  wstring local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  wstring local_1b8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_198;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_178;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_158;
  undefined1 local_138 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> code;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_110;
  time_point t2;
  time_point t1;
  time_point t0;
  bool expect_failure;
  anon_struct_32_4_a04a10f4 *t;
  int i;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  wstring local_c8;
  undefined1 local_a8 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> helper_code;
  undefined1 local_80 [4];
  int unexpected;
  gc_heap h;
  int num_tests;
  
  vVar2 = tested_version();
  if (vVar2 == es5) {
    h.gc_state_.weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x4d7;
    mjs::gc_heap::gc_heap((gc_heap *)local_80,0x100000);
    helper_code.field_2._M_local_buf[3] = L'\0';
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,
               "\n// ----------------------------------------------\n// helpers that unittests can use (typically in\n// their prereq function).\n// ----------------------------------------------\nfunction fnExists(/*arguments*/) {\n  for (var i=0; i<arguments.length; i++) {\n     if (typeof(arguments[i]) !== \"function\") return false;\n     }\n  return true;\n}\n\nfunction fnGlobalObject() {\n  return (function () {return this}).call(null);\n  }\n\nfunction compareValues(v1, v2)\n{\n  if (v1 === 0 && v2 === 0)\n    return 1 / v1 === 1 / v2;\n  if (v1 !== v1 && v2 !== v2)\n    return true;\n  return v1 === v2;\n}\n\nfunction isSubsetOf(aSubset, aArray) {\n  if (aArray.length < aSubset.length) {\n    return false;\n  }\n\n  var sortedSubset = [].concat(aSubset).sort();\n  var sortedArray = [].concat(aArray).sort();\n\n  nextSubsetMember:\n  for (var i = 0, j = 0; i < sortedSubset.length; i++) {\n    var v = sortedSubset[i];\n    while (j < sortedArray.length) {\n      if (compareValues(v, sortedArray[j++])) {\n        continue nextSubsetMember;\n      }\n    }\n\n    return false;\n  }\n\n  return true;\n}\n"
              );
    in._M_str = in_RCX;
    in._M_len = (size_t)local_d8._M_str;
    mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_c8,(unicode *)local_d8._M_len,in);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_a8,&local_c8,L";");
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    for (t._0_4_ = 0; (int)t < 0x4d7; t._0_4_ = (int)t + 1) {
      lVar13 = (long)(int)t;
      paVar6 = tests + lVar13;
      piVar7 = std::begin<int_const,10ul>(&expected_failures);
      piVar8 = std::end<int_const,10ul>(&expected_failures);
      piVar7 = std::find<int_const*,int>(piVar7,piVar8,(int *)&t);
      piVar8 = std::end<int_const,10ul>(&expected_failures);
      bVar14 = piVar7 != piVar8;
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&t1);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&t2);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&local_110);
      iVar3 = mjs::gc_heap::use_percentage((gc_heap *)local_80);
      if (0x32 < iVar3) {
        mjs::gc_heap::garbage_collect((gc_heap *)local_80);
      }
      code.field_2._8_8_ = std::chrono::_V2::system_clock::now();
      t1.__d.__r = (duration)(duration)code.field_2._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c8,tests[lVar13].prelude);
      in_00._M_str = (char *)piVar8;
      in_00._M_len = (size_t)local_1c8._M_str;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_1b8,(unicode *)local_1c8._M_len,in_00);
      std::operator+(&local_198,&local_1b8,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_a8);
      std::operator+(&local_178,&local_198,L"(function(){");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&bs,tests[lVar13].code);
      in_01._M_str = (char *)piVar8;
      in_01._M_len = (size_t)local_1f0;
      mjs::unicode::utf8_to_utf16_abi_cxx11_
                (&local_1e8,
                 (unicode *)
                 bs._M_t.
                 super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
                 .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl,in_01);
      std::operator+(&local_158,&local_178,&local_1e8);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_138,&local_158,L"})()");
      std::__cxx11::wstring::~wstring((wstring *)&local_158);
      std::__cxx11::wstring::~wstring((wstring *)&local_1e8);
      std::__cxx11::wstring::~wstring((wstring *)&local_178);
      std::__cxx11::wstring::~wstring((wstring *)&local_198);
      std::__cxx11::wstring::~wstring((wstring *)&local_1b8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_248,paVar6->id);
      in_02._M_str = (char *)piVar8;
      in_02._M_len = (size_t)local_248._M_str;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_238,(unicode *)local_248._M_len,in_02);
      std::make_unique<mjs::source_file,std::__cxx11::wstring,std::__cxx11::wstring&,mjs::version>
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_218,&local_238,(version *)local_138);
      std::shared_ptr<mjs::source_file>::
      shared_ptr<mjs::source_file,std::default_delete<mjs::source_file>,void>
                ((shared_ptr<mjs::source_file> *)(local_218 + 8),
                 (unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_> *)local_218);
      mjs::parse((mjs *)&local_200,(shared_ptr<mjs::source_file> *)(local_218 + 8),non_strict);
      std::shared_ptr<mjs::source_file>::~shared_ptr
                ((shared_ptr<mjs::source_file> *)(local_218 + 8));
      std::unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_>::~unique_ptr
                ((unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_> *)local_218);
      std::__cxx11::wstring::~wstring((wstring *)&local_238);
      interpreter_.impl_._M_t.
      super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
      .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl =
           (unique_ptr<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>)
           std::chrono::_V2::system_clock::now();
      this = &res.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_;
      t2.__d.__r = (duration)
                   (duration)
                   interpreter_.impl_._M_t.
                   super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
                   .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl;
      std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::function
                ((function<void_(const_mjs::statement_&,_const_mjs::completion_&)> *)this);
      mjs::interpreter::interpreter
                (&local_260,(gc_heap *)local_80,es5,(on_statement_executed_type *)this);
      std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::~function
                ((function<void_(const_mjs::statement_&,_const_mjs::completion_&)> *)
                 &res.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
      s = std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::
          operator*(&local_200);
      mjs::interpreter::eval((value *)local_2a8,&local_260,&s->super_statement);
      vVar4 = mjs::value::type((value *)local_2a8);
      if ((vVar4 != boolean) || (bVar1 = mjs::value::boolean_value((value *)local_2a8), !bVar1)) {
        std::__cxx11::wostringstream::wostringstream(local_420);
        pwVar9 = std::operator<<((wostream *)local_420,"Unexpected result: ");
        mjs::to_string((mjs *)&local_440,(gc_heap *)local_80,(value *)local_2a8);
        wVar15 = mjs::string::view(&local_440);
        local_428 = wVar15._M_str;
        pwVar10 = (wchar_t *)wVar15._M_len;
        local_430 = pwVar10;
        std::operator<<(pwVar9,wVar15);
        mjs::string::~string(&local_440);
        local_491 = 1;
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::wostringstream::str();
        local_470 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_490);
        wVar15._M_len = local_470._8_8_;
        wVar15._M_str = pwVar10;
        mjs::unicode::utf16_to_utf8_abi_cxx11_(&local_460,local_470._0_8_,wVar15);
        std::runtime_error::runtime_error(prVar11,(string *)&local_460);
        local_491 = 0;
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (bVar14) {
        pwVar9 = std::operator<<((wostream *)&std::wcerr,"Test ");
        local_498 = (int)std::setw(4);
        pwVar9 = std::operator<<(pwVar9,(_Setw)local_498);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,(int)t);
        pwVar9 = std::operator<<(pwVar9," passed: ");
        e._4_4_ = std::setw(0x14);
        pwVar9 = std::operator<<(pwVar9,e._4_4_);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,std::left);
        pwVar9 = std::operator<<(pwVar9,paVar6->id);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,std::right);
        pwVar9 = std::operator<<(pwVar9," ");
        pwVar9 = std::operator<<(pwVar9,tests[lVar13].description);
        std::operator<<(pwVar9," -- EXPECTED FAILURE\n");
        helper_code.field_2._M_local_buf[3] = helper_code.field_2._M_local_buf[3] + L'\x01';
      }
      mjs::value::~value((value *)local_2a8);
      mjs::interpreter::~interpreter(&local_260);
      std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::~unique_ptr
                (&local_200);
      std::__cxx11::wstring::~wstring((wstring *)local_138);
      d0 = (rep)std::chrono::_V2::system_clock::now();
      local_110.__d.__r = (duration)(duration)d0;
      d1 = (rep)std::chrono::operator-(&t2,&t1);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_4c8,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&d1);
      local_4c0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_4c8);
      local_4e8.__r = (rep_conflict)std::chrono::operator-(&local_110,&t2);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_4e0,&local_4e8);
      local_4d8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_4e0);
      if (1.0 < local_4d8) {
        _Var5 = std::setw(4);
        pwVar9 = std::operator<<((wostream *)&std::wcout,_Var5);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,(int)t);
        pwVar9 = std::operator<<(pwVar9," ");
        _Var5 = std::setw(10);
        pwVar9 = std::operator<<(pwVar9,_Var5);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,local_4c0 * 1000.0);
        pwVar9 = std::operator<<(pwVar9," ");
        _Var5 = std::setw(10);
        pwVar9 = std::operator<<(pwVar9,_Var5);
        pwVar9 = (wostream *)std::wostream::operator<<(pwVar9,local_4d8 * 1000.0);
        pwVar9 = std::operator<<(pwVar9," ");
        pwVar9 = std::operator<<(pwVar9,paVar6->id);
        std::operator<<(pwVar9," is slow\n");
      }
    }
    if (helper_code.field_2._M_local_buf[3] != L'\0') {
      std::__cxx11::ostringstream::ostringstream(local_670);
      poVar12 = (ostream *)std::ostream::operator<<(local_670,helper_code.field_2._M_local_buf[3]);
      std::operator<<(poVar12," unexpected result(s)");
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar11,local_690);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_a8);
    mjs::gc_heap::~gc_heap((gc_heap *)local_80);
  }
  return;
}

Assistant:

void test_main() {
    if (tested_version() != version::es5) {
        return;
    }

    constexpr int num_tests = sizeof(tests)/sizeof(*tests);
    gc_heap h{1<<20};
    int unexpected = 0;
    const auto helper_code = unicode::utf8_to_utf16(helper_functions) + L";";
    for (int i = 0; i < num_tests; ++i) {
        const auto& t = tests[i];
        const bool expect_failure = std::find(std::begin(expected_failures), std::end(expected_failures), i) != std::end(expected_failures);

        //std::wcout << std::setw(4) <<  (i+1) << "/" << num_tests << "\r" << std::flush;

        std::chrono::high_resolution_clock::time_point t0, t1, t2;

        try {
            if (h.use_percentage() > 50) {
                h.garbage_collect();
            }

            t0 = std::chrono::high_resolution_clock::now();

            auto code = unicode::utf8_to_utf16(t.prelude) +  helper_code + L"(function(){" + unicode::utf8_to_utf16(t.code) + L"})()";
            auto bs = parse(std::make_unique<source_file>(unicode::utf8_to_utf16(t.id), code, version::es5));

            t1 = std::chrono::high_resolution_clock::now();

            // Could be optimized to reuse interpreter but take to restore global object
            interpreter interpreter_{h, version::es5};
            auto res = interpreter_.eval(*bs);
            if (res.type() != value_type::boolean || !res.boolean_value()) {
                std::wostringstream woss;
                woss << "Unexpected result: " << to_string(h, res).view();
                throw std::runtime_error(unicode::utf16_to_utf8(woss.str()));
            }
            if (expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " passed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << " -- EXPECTED FAILURE\n";
                ++unexpected;
            }
        } catch (const std::exception& e) {
            if (!expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " failed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << "\n";
                std::wcerr << e.what() << "\n";
            }
            if (!expect_failure) {
                ++unexpected;
            }
        }

        t2 = std::chrono::high_resolution_clock::now();

        const auto d0 = std::chrono::duration<double>(t1-t0).count();
        const auto d1 = std::chrono::duration<double>(t2-t1).count();
        if (d1>1) {
            std::wcout << std::setw(4) << i << " " << std::setw(10) << d0*1000 << " " << std::setw(10) << d1*1000 << " " << t.id << " is slow\n";
        }
    }
    if (unexpected) {
        std::ostringstream oss;
        oss << unexpected << " unexpected result(s)";
        throw std::runtime_error(oss.str());
    }
}